

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Reverb::render(V2Reverb *this,StereoSample *dest,int nsamples)

{
  uint uVar1;
  V2Instance *pVVar2;
  long lVar3;
  float fVar4;
  int iVar5;
  ulong uVar6;
  undefined1 *puVar7;
  int j;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  if (0 < nsamples) {
    pVVar2 = this->inst;
    uVar6 = 0;
    do {
      fVar12 = pVVar2->aux1buf[uVar6] * this->gainin + 3.8146973e-06;
      lVar3 = 0;
      puVar7 = &this->field_0xc8;
      lVar9 = 0;
      do {
        fVar13 = 0.0;
        uVar8 = 0;
        lVar10 = lVar3;
        do {
          fVar15 = fVar12;
          if ((uVar8 & 1) != 0) {
            fVar15 = -fVar12;
          }
          fVar4 = this->gaina[lVar10 + 6];
          fVar14 = *(float *)((long)this->combl[0] + lVar10);
          fVar14 = ((this->gainc[uVar8] *
                     *(float *)(*(long *)(this->gaina + lVar10 + 8) + (ulong)(uint)fVar4 * 4) +
                    fVar15) - fVar14) * this->damp + fVar14;
          *(float *)(*(long *)(this->gaina + lVar10 + 8) + (ulong)(uint)fVar4 * 4) = fVar14;
          fVar4 = (float)((int)fVar4 + 1);
          if (fVar4 == this->gaina[lVar10 + 7]) {
            fVar4 = 0.0;
          }
          this->gaina[lVar10 + 6] = fVar4;
          fVar13 = fVar13 + fVar14;
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 4;
        } while (uVar8 != 4);
        lVar10 = 0;
        do {
          uVar1 = *(uint *)(puVar7 + lVar10 * 4);
          fVar15 = *(float *)(*(long *)(puVar7 + lVar10 * 4 + 8) + (ulong)uVar1 * 4);
          fVar13 = *(float *)((long)this->gaina + lVar10) * fVar15 + fVar13;
          *(float *)(*(long *)(puVar7 + lVar10 * 4 + 8) + (ulong)uVar1 * 4) = fVar13;
          iVar5 = uVar1 + 1;
          if (iVar5 == *(int *)(puVar7 + lVar10 * 4 + 4)) {
            iVar5 = 0;
          }
          *(int *)(puVar7 + lVar10 * 4) = iVar5;
          fVar13 = fVar15 - fVar13 * *(float *)((long)this->gaina + lVar10);
          lVar10 = lVar10 + 4;
        } while (lVar10 == 4);
        fVar15 = (fVar13 - this->hpf[lVar9]) * this->lowcut + this->hpf[lVar9];
        this->hpf[lVar9] = fVar15;
        dest->ch[uVar6 * 2 + lVar9] = (fVar13 - fVar15) + dest->ch[uVar6 * 2 + lVar9];
        lVar3 = lVar3 + 0x10;
        puVar7 = puVar7 + 0x20;
        bVar11 = lVar9 == 0;
        lVar9 = lVar9 + 1;
      } while (bVar11);
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nsamples);
  }
  return;
}

Assistant:

void render(StereoSample *dest, int nsamples)
    {
        const float *inbuf = inst->aux1buf;

        COVER("RVB render");

        for (int i=0; i < nsamples; i++)
        {
            float in = inbuf[i] * gainin + fcdcoffset;

            for (int ch=0; ch < 2; ch++)
            {
                // parallel comb filters
                float cur = 0.0f;
                for (int j=0; j < 4; j++)
                {
                    float dv = gainc[j] * combd[ch][j].fetch();
                    float nv = (j & 1) ? (dv - in) : (dv + in); // alternate phase on combs
                    float lp = combl[ch][j] + damp * (nv - combl[ch][j]);
                    combd[ch][j].feed(lp);
                    cur += lp;
                }

                // serial allpass filters
                for (int j=0; j < 2; j++)
                {
                    float dv = alld[ch][j].fetch();
                    float dz = cur + gaina[j] * dv;
                    alld[ch][j].feed(dz);
                    cur = dv - gaina[j] * dz;
                }

                // low cut and output
                hpf[ch] += lowcut * (cur - hpf[ch]);
                dest[i].ch[ch] += cur - hpf[ch];
            }
        }
    }